

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdf-custom-filter.cc
# Opt level: O3

void __thiscall
StreamReplacer::registerStream
          (StreamReplacer *this,QPDFObjectHandle *stream,
          shared_ptr<QPDFObjectHandle::StreamDataProvider> *self)

{
  map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined1 auVar2 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  QPDFObjectHandle *pQVar4;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> *psVar5;
  bool bVar6;
  char cVar7;
  const_iterator cVar8;
  mapped_type *pmVar9;
  _Rb_tree_node_base *p_Var10;
  mapped_type *pmVar11;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>
  __l;
  QPDFObjGen og;
  QPDFObjectHandle protect;
  QPDFObjectHandle dict;
  QPDFObjectHandle dict_updates;
  QPDFObjectHandle decode_parms;
  QPDFObjectHandle dp_stream;
  string p_str;
  allocator_type local_12a;
  less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_129;
  undefined1 local_128 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  _Base_ptr local_118;
  _Rb_tree_node_base *local_110;
  QPDFObjGen local_f0;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
  local_e8;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  string local_a8 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_a0;
  QPDFObjectHandle local_98;
  QPDFObjectHandle *local_88;
  shared_ptr<QPDFObjectHandle::StreamDataProvider> *local_80;
  StreamReplacer *local_78;
  map local_70 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_68;
  QPDFObjectHandle local_60;
  mapped_type *local_50;
  undefined8 local_48;
  mapped_type local_40;
  undefined1 uStack_3f;
  undefined6 uStack_3e;
  
  local_f0 = (QPDFObjGen)QPDFObjectHandle::getObjGen();
  this_00 = &this->copied_streams;
  cVar8 = std::
          _Rb_tree<QPDFObjGen,_std::pair<const_QPDFObjGen,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
          ::find(&this_00->_M_t,&local_f0);
  if ((_Rb_tree_header *)cVar8._M_node == &(this->copied_streams)._M_t._M_impl.super__Rb_tree_header
     ) {
    QPDFObjectHandle::newNull();
    pmVar9 = std::
             map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
             ::operator[](this_00,&local_f0);
    p_Var3 = p_Stack_120;
    auVar2 = local_128;
    local_128 = (undefined1  [8])0x0;
    p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    p_Var1 = (pmVar9->super_BaseHandle).obj.
             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
    (pmVar9->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)auVar2;
    (pmVar9->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = p_Var3;
    if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
    }
    if (p_Stack_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_120);
    }
    QPDFObjectHandle::newDictionary();
    bVar6 = maybeReplace(this,local_f0,stream,(Pipeline *)0x0,&local_98);
    if (bVar6) {
      QPDFObjectHandle::copyStream();
      pmVar9 = std::
               map<QPDFObjGen,_QPDFObjectHandle,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_QPDFObjectHandle>_>_>
               ::operator[](this_00,&local_f0);
      p_Var3 = p_Stack_120;
      auVar2 = local_128;
      local_128 = (undefined1  [8])0x0;
      p_Stack_120 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var1 = (pmVar9->super_BaseHandle).obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
      (pmVar9->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)auVar2;
      (pmVar9->super_BaseHandle).obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = p_Var3;
      if (p_Var1 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var1);
      }
      if (p_Stack_120 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_120);
      }
      local_78 = this;
      QPDFObjectHandle::getDict();
      local_88 = stream;
      local_80 = self;
      QPDFObjectHandle::getKeys_abi_cxx11_();
      if (local_110 != (_Rb_tree_node_base *)&p_Stack_120) {
        p_Var10 = local_110;
        do {
          QPDFObjectHandle::getKey((string *)&local_e8);
          QPDFObjectHandle::replaceKey(local_a8,(QPDFObjectHandle *)(p_Var10 + 1));
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.first._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_e8.first._M_string_length);
          }
          p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
        } while (p_Var10 != (_Rb_tree_node_base *)&p_Stack_120);
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_128);
      pmVar11 = std::
                map<QPDFObjGen,_unsigned_char,_std::less<QPDFObjGen>,_std::allocator<std::pair<const_QPDFObjGen,_unsigned_char>_>_>
                ::operator[](&local_78->keys,&local_f0);
      local_40 = *pmVar11;
      local_48 = 1;
      uStack_3f = 0;
      local_50 = &local_40;
      QPDF::newStream((string *)&local_60);
      psVar5 = local_80;
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>
      ::pair<const_char_(&)[11],_QPDFObjectHandle_&,_true>
                (&local_e8,(char (*) [11])"/KeyStream",&local_60);
      __l._M_len = 1;
      __l._M_array = &local_e8;
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
             *)local_128,__l,&local_129,&local_12a);
      pQVar4 = local_88;
      QPDFObjectHandle::newDictionary(local_70);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDFObjectHandle>_>_>
                   *)local_128);
      if (local_e8.second.super_BaseHandle.obj.
          super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_e8.second.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8.first._M_dataplus._M_p != &local_e8.first.field_2) {
        operator_delete(local_e8.first._M_dataplus._M_p,
                        local_e8.first.field_2._M_allocated_capacity + 1);
      }
      local_b8 = (psVar5->
                 super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
      local_b0 = (psVar5->
                 super___shared_ptr<QPDFObjectHandle::StreamDataProvider,_(__gnu_cxx::_Lock_policy)2>
                 )._M_refcount._M_pi;
      if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          local_b0->_M_use_count = local_b0->_M_use_count + 1;
          UNLOCK();
        }
        else {
          local_b0->_M_use_count = local_b0->_M_use_count + 1;
        }
      }
      local_128 = (undefined1  [8])&local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/XORDecode","");
      QPDFObjectHandle::newName((string *)&local_e8);
      QPDFObjectHandle::replaceStreamData(pQVar4,&local_b8,&local_e8,local_70);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.first._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.first._M_string_length);
      }
      if (local_128 != (undefined1  [8])&local_118) {
        operator_delete((void *)local_128,(ulong)((long)&local_118->_M_color + 1));
      }
      if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
      }
      local_128 = (undefined1  [8])&local_118;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_128,"/ProtectXOR","");
      QPDFObjectHandle::getKey((string *)&local_e8);
      if (local_128 != (undefined1  [8])&local_118) {
        operator_delete((void *)local_128,(ulong)((long)&local_118->_M_color + 1));
      }
      cVar7 = QPDFObjectHandle::isBool();
      if (cVar7 != '\0') {
        cVar7 = QPDFObjectHandle::getBoolValue();
        if (cVar7 != '\0') {
          QPDFObjectHandle::setFilterOnWrite(SUB81(pQVar4,0));
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.first._M_string_length !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8.first._M_string_length);
      }
      if (local_68 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_68);
      }
      if (local_60.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_60.super_BaseHandle.obj.
                   super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
      }
      if (local_50 != &local_40) {
        operator_delete(local_50,CONCAT62(uStack_3e,CONCAT11(uStack_3f,local_40)) + 1);
      }
      if (local_a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_a0);
      }
    }
    if (local_98.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.super_BaseHandle.obj.
                 super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

void
StreamReplacer::registerStream(
    QPDFObjectHandle stream, std::shared_ptr<QPDFObjectHandle::StreamDataProvider> self)
{
    QPDFObjGen og(stream.getObjGen());

    // We don't need to process a stream more than once. In this example, we are just iterating
    // through objects, but if we were doing something like iterating through images on pages, we
    // might realistically encounter the same stream more than once.
    if (this->copied_streams.count(og) > 0) {
        return;
    }
    // Store something in copied_streams so that we don't double-process even in the negative case.
    // This gets replaced later if needed.
    this->copied_streams[og] = QPDFObjectHandle::newNull();

    // Call maybeReplace with dict_updates. In this mode, it determines whether we should replace
    // the stream data and, if so, supplies dictionary updates we should make.
    bool should_replace = false;
    QPDFObjectHandle dict_updates = QPDFObjectHandle::newDictionary();
    try {
        should_replace = maybeReplace(og, stream, nullptr, &dict_updates);
    } catch (std::exception& e) {
        stream.warnIfPossible(std::string("exception while attempting to replace: ") + e.what());
    }

    if (should_replace) {
        // Copy the stream so we can get to the original data from the stream data provider. This
        // doesn't actually copy any data, but the copy retains the original stream data after the
        // original one is modified.
        this->copied_streams[og] = stream.copyStream();
        // Update the stream dictionary with any changes.
        auto dict = stream.getDict();
        for (auto const& k: dict_updates.getKeys()) {
            dict.replaceKey(k, dict_updates.getKey(k));
        }
        // Create the key stream that will be referenced from /DecodeParms. We have to do this now
        // since you can't modify or create objects during write.
        char p[1] = {static_cast<char>(this->keys[og])};
        std::string p_str(p, 1);
        QPDFObjectHandle dp_stream = this->pdf->newStream(p_str);
        // Create /DecodeParms as expected by our fictitious /XORDecode filter.
        QPDFObjectHandle decode_parms =
            QPDFObjectHandle::newDictionary({{"/KeyStream", dp_stream}});
        stream.replaceStreamData(self, QPDFObjectHandle::newName("/XORDecode"), decode_parms);
        // Further, if /ProtectXOR = true, we disable filtering on write so that QPDFWriter will not
        // decode the stream even though we have registered a stream filter for /XORDecode.
        auto protect = dict.getKey("/ProtectXOR");
        if (protect.isBool() && protect.getBoolValue()) {
            stream.setFilterOnWrite(false);
        }
    }
}